

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void __thiscall
google::protobuf::io::Tokenizer::ConsumeBlockComment(Tokenizer *this,string *content)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  allocator local_59;
  uint local_58;
  uint local_54;
  string local_50;
  
  if (content != (string *)0x0) {
    this->record_target_ = content;
    this->record_start_ = this->buffer_pos_;
  }
  local_58 = this->line_;
  local_54 = this->column_ - 2;
  while( true ) {
    while( true ) {
      while ((0x2f < (ulong)(byte)this->current_char_ ||
             ((0x840000000401U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) == 0))) {
        NextChar(this);
      }
      bVar2 = TryConsume(this,'\n');
      if (bVar2) break;
      bVar2 = TryConsume(this,'*');
      if ((bVar2) && (bVar2 = TryConsume(this,'/'), bVar2)) {
        if (content == (string *)0x0) {
          return;
        }
        StopRecording(this);
        std::__cxx11::string::erase((ulong)content,content->_M_string_length - 2);
        return;
      }
      bVar2 = TryConsume(this,'/');
      if (this->current_char_ == '*' && bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "\"/*\" inside block comment.  Block comments cannot be nested.",&local_59);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else if (this->current_char_ == '\0') {
        std::__cxx11::string::string
                  ((string *)&local_50,"End-of-file inside block comment.",&local_59);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pEVar1 = this->error_collector_;
        std::__cxx11::string::string((string *)&local_50,"  Comment started here.",&local_59);
        (*pEVar1->_vptr_ErrorCollector[2])(pEVar1,(ulong)local_58,(ulong)local_54,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (content != (string *)0x0) {
          StopRecording(this);
        }
        return;
      }
    }
    if (content != (string *)0x0) {
      StopRecording(this);
    }
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    bVar2 = TryConsume(this,'*');
    if ((bVar2) && (bVar2 = TryConsume(this,'/'), bVar2)) break;
    if (content != (string *)0x0) {
      this->record_target_ = content;
      this->record_start_ = this->buffer_pos_;
    }
  }
  return;
}

Assistant:

void Tokenizer::ConsumeBlockComment(std::string* content) {
  int start_line = line_;
  int start_column = column_ - 2;

  if (content != NULL) RecordTo(content);

  while (true) {
    while (current_char_ != '\0' && current_char_ != '*' &&
           current_char_ != '/' && current_char_ != '\n') {
      NextChar();
    }

    if (TryConsume('\n')) {
      if (content != NULL) StopRecording();

      // Consume leading whitespace and asterisk;
      ConsumeZeroOrMore<WhitespaceNoNewline>();
      if (TryConsume('*')) {
        if (TryConsume('/')) {
          // End of comment.
          break;
        }
      }

      if (content != NULL) RecordTo(content);
    } else if (TryConsume('*') && TryConsume('/')) {
      // End of comment.
      if (content != NULL) {
        StopRecording();
        // Strip trailing "*/".
        content->erase(content->size() - 2);
      }
      break;
    } else if (TryConsume('/') && current_char_ == '*') {
      // Note:  We didn't consume the '*' because if there is a '/' after it
      //   we want to interpret that as the end of the comment.
      AddError(
          "\"/*\" inside block comment.  Block comments cannot be nested.");
    } else if (current_char_ == '\0') {
      AddError("End-of-file inside block comment.");
      error_collector_->AddError(start_line, start_column,
                                 "  Comment started here.");
      if (content != NULL) StopRecording();
      break;
    }
  }
}